

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O2

EStatusCode __thiscall
CFFPrimitiveReader::Read(CFFPrimitiveReader *this,Byte *ioBuffer,LongBufferSizeType inBufferSize)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (this->mInternalState != eFailure) {
    iVar1 = (*(this->mCFFFile->super_IByteReader)._vptr_IByteReader[2])();
    if (CONCAT44(extraout_var,iVar1) == inBufferSize) {
      return eSuccess;
    }
    this->mInternalState = eFailure;
  }
  return eFailure;
}

Assistant:

EStatusCode CFFPrimitiveReader::Read(Byte* ioBuffer,LongBufferSizeType inBufferSize)
{
	if(PDFHummus::eFailure == mInternalState)
		return PDFHummus::eFailure;

	EStatusCode status = (mCFFFile->Read(ioBuffer,inBufferSize) == inBufferSize ? PDFHummus::eSuccess : PDFHummus::eFailure);

	if(PDFHummus::eFailure == status)
		mInternalState = PDFHummus::eFailure;
	return status;	
}